

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerLdAsmJsEnv(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint32 offset;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar3;
  Instr *pIVar4;
  Opnd *pOVar5;
  RegOpnd *baseOpnd;
  IndirOpnd *newSrc;
  IndirOpnd *indirOpnd;
  Instr *instrPrev;
  Opnd *functionObjOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  functionObjOpnd = (Opnd *)instr;
  instr_local = (Instr *)this;
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6f36,"(m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pIVar4 = LowererMD::LoadFunctionObjectOpnd
                     (&this->m_lowererMD,(Instr *)functionObjOpnd,(Opnd **)&instrPrev);
  pOVar5 = IR::Instr::GetSrc1((Instr *)functionObjOpnd);
  if (pOVar5 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6f39,"(!instr->GetSrc1())","!instr->GetSrc1()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  baseOpnd = IR::Opnd::AsRegOpnd((Opnd *)instrPrev);
  offset = Js::AsmJsScriptFunction::GetOffsetOfModuleMemory();
  newSrc = IR::IndirOpnd::New(baseOpnd,offset,TyUint64,this->m_func,false);
  IR::Instr::SetSrc1((Instr *)functionObjOpnd,&newSrc->super_Opnd);
  LowererMD::ChangeToAssign((Instr *)functionObjOpnd);
  return pIVar4;
}

Assistant:

IR::Instr *
Lowerer::LowerLdAsmJsEnv(IR::Instr * instr)
{
    Assert(m_func->GetJITFunctionBody()->IsAsmJsMode());
    IR::Opnd * functionObjOpnd;
    IR::Instr * instrPrev = this->m_lowererMD.LoadFunctionObjectOpnd(instr, functionObjOpnd);
    Assert(!instr->GetSrc1());
    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(functionObjOpnd->AsRegOpnd(), Js::AsmJsScriptFunction::GetOffsetOfModuleMemory(), TyMachPtr, m_func);
    instr->SetSrc1(indirOpnd);
    LowererMD::ChangeToAssign(instr);

    return instrPrev;
}